

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep_io.c
# Opt level: O3

int SPRKStepGetNumRhsEvals(void *arkode_mem,long *nf1,long *nf2)

{
  int iVar1;
  
  iVar1 = ARKodeGetNumRhsEvals(arkode_mem,0,nf1);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = ARKodeGetNumRhsEvals(arkode_mem,1,nf2);
  return iVar1;
}

Assistant:

int SPRKStepGetNumRhsEvals(void* arkode_mem, long int* nf1, long int* nf2)
{
  int retval = ARK_SUCCESS;

  retval = ARKodeGetNumRhsEvals(arkode_mem, 0, nf1);
  if (retval != ARK_SUCCESS) { return retval; }

  retval = ARKodeGetNumRhsEvals(arkode_mem, 1, nf2);
  if (retval != ARK_SUCCESS) { return retval; }

  return ARK_SUCCESS;
}